

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locmap.cpp
# Opt level: O1

int32_t uprv_convertToPosix_63
                  (uint32_t hostid,char *posixID,int32_t posixIDCapacity,UErrorCode *status)

{
  int32_t iVar1;
  UErrorCode UVar2;
  uint *puVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  char *__s;
  int32_t iVar7;
  
  lVar5 = 8;
  __s = (char *)0x0;
  do {
    puVar3 = *(uint **)((long)&gPosixIDmap[0].numRegions + lVar5);
    if ((hostid & 0x3ff) == *puVar3) {
      if ((ulong)*(uint *)((long)&PTR_typeinfo_00403818 + lVar5) == 0) goto LAB_0031cc2c;
      lVar6 = 0;
      goto LAB_0031cc19;
    }
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x8d8);
  goto LAB_0031cc30;
  while (lVar6 = lVar6 + 0x10, (ulong)*(uint *)((long)&PTR_typeinfo_00403818 + lVar5) << 4 != lVar6)
  {
LAB_0031cc19:
    if (*(uint32_t *)((long)puVar3 + lVar6) == hostid) {
      puVar3 = (uint *)((long)puVar3 + lVar6);
      break;
    }
  }
LAB_0031cc2c:
  __s = *(char **)(puVar3 + 2);
LAB_0031cc30:
  if (__s == (char *)0x0) {
    iVar7 = -1;
    UVar2 = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    sVar4 = strlen(__s);
    iVar7 = (int32_t)sVar4;
    iVar1 = posixIDCapacity;
    if (iVar7 < posixIDCapacity) {
      iVar1 = iVar7;
    }
    memcpy(posixID,__s,(long)iVar1);
    if (iVar7 < posixIDCapacity) {
      posixID[iVar7] = '\0';
      UVar2 = U_ZERO_ERROR;
      if (*status != U_STRING_NOT_TERMINATED_WARNING) {
        return iVar7;
      }
    }
    else {
      UVar2 = U_BUFFER_OVERFLOW_ERROR;
      if (iVar7 == posixIDCapacity) {
        UVar2 = U_STRING_NOT_TERMINATED_WARNING;
      }
    }
  }
  *status = UVar2;
  return iVar7;
}

Assistant:

U_CAPI int32_t
uprv_convertToPosix(uint32_t hostid, char *posixID, int32_t posixIDCapacity, UErrorCode* status)
{
    uint16_t langID;
    uint32_t localeIndex;
    UBool bLookup = TRUE;
    const char *pPosixID = NULL;

#ifdef USE_WINDOWS_LCID_MAPPING_API
    char locName[LOCALE_NAME_MAX_LENGTH] = {};      // ICU name can't be longer than Windows name

    // Note: Windows primary lang ID 0x92 in LCID is used for Central Kurdish and
    // GetLocaleInfo() maps such LCID to "ku". However, CLDR uses "ku" for
    // Northern Kurdish and "ckb" for Central Kurdish. For this reason, we cannot
    // use the Windows API to resolve locale ID for this specific case.
    if ((hostid & 0x3FF) != 0x92) {
        int32_t tmpLen = 0;
        UChar windowsLocaleName[LOCALE_NAME_MAX_LENGTH];  // ULOC_FULLNAME_CAPACITY > LOCALE_NAME_MAX_LENGTH

        // Note: LOCALE_ALLOW_NEUTRAL_NAMES was enabled in Windows7+, prior versions did not handle neutral (no-region) locale names.
        tmpLen = LCIDToLocaleName(hostid, (PWSTR)windowsLocaleName, UPRV_LENGTHOF(windowsLocaleName), LOCALE_ALLOW_NEUTRAL_NAMES);
        if (tmpLen > 1) {
            int32_t i = 0;
            // Only need to look up in table if have _, eg for de-de_phoneb type alternate sort.
            bLookup = FALSE;
            for (i = 0; i < UPRV_LENGTHOF(locName); i++)
            {
                locName[i] = (char)(windowsLocaleName[i]);

                // Windows locale name may contain sorting variant, such as "es-ES_tradnl".
                // In such cases, we need special mapping data found in the hardcoded table
                // in this source file.
                if (windowsLocaleName[i] == L'_')
                {
                    // Keep the base locale, without variant
                    // TODO: Should these be mapped from _phoneb to @collation=phonebook, etc.?
                    locName[i] = '\0';
                    tmpLen = i;
                    bLookup = TRUE;
                    break;
                }
                else if (windowsLocaleName[i] == L'-')
                {
                    // Windows names use -, ICU uses _
                    locName[i] = '_';
                }
                else if (windowsLocaleName[i] == L'\0')
                {
                    // No point in doing more work than necessary
                    break;
                }
            }
            // TODO: Need to understand this better, why isn't it an alias?
            FIX_LANGUAGE_ID_TAG(locName, tmpLen);
            pPosixID = locName;
        }
    }
#endif // USE_WINDOWS_LCID_MAPPING_API

    if (bLookup) {
        const char *pCandidate = NULL;
        langID = LANGUAGE_LCID(hostid);

        for (localeIndex = 0; localeIndex < gLocaleCount; localeIndex++) {
            if (langID == gPosixIDmap[localeIndex].regionMaps->hostID) {
                pCandidate = getPosixID(&gPosixIDmap[localeIndex], hostid);
                break;
            }
        }

        /* On Windows, when locale name has a variant, we still look up the hardcoded table.
           If a match in the hardcoded table is longer than the Windows locale name without
           variant, we use the one as the result */
        if (pCandidate && (pPosixID == NULL || uprv_strlen(pCandidate) > uprv_strlen(pPosixID))) {
            pPosixID = pCandidate;
        }
    }

    if (pPosixID) {
        int32_t resLen = static_cast<int32_t>(uprv_strlen(pPosixID));
        int32_t copyLen = resLen <= posixIDCapacity ? resLen : posixIDCapacity;
        uprv_memcpy(posixID, pPosixID, copyLen);
        if (resLen < posixIDCapacity) {
            posixID[resLen] = 0;
            if (*status == U_STRING_NOT_TERMINATED_WARNING) {
                *status = U_ZERO_ERROR;
            }
        } else if (resLen == posixIDCapacity) {
            *status = U_STRING_NOT_TERMINATED_WARNING;
        } else {
            *status = U_BUFFER_OVERFLOW_ERROR;
        }
        return resLen;
    }

    /* no match found */
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return -1;
}